

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O3

void aom_write_primitive_refsubexpfin(aom_writer *w,uint16_t n,uint16_t k,uint16_t ref,uint16_t v)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  undefined6 in_register_0000000a;
  uint uVar4;
  uint uVar5;
  undefined6 in_register_00000032;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  iVar8 = (int)CONCAT62(in_register_0000000a,ref);
  uVar5 = (uint)CONCAT62(in_register_00000032,n);
  uVar6 = (uint)v;
  if (uVar5 < (uint)(iVar8 * 2)) {
    uVar4 = (uVar5 - 1) - iVar8;
    uVar6 = (uVar5 - 1) - uVar6;
    if ((uVar4 & 0xffff) * 2 < (uVar6 & 0xffff)) goto LAB_002a1db6;
    if ((ushort)uVar6 < (ushort)uVar4) {
      uVar6 = (uVar4 - uVar6) * 2 - 1;
      goto LAB_002a1db6;
    }
    iVar8 = uVar6 - uVar4;
  }
  else {
    if ((uint)(iVar8 * 2) < (uint)v) goto LAB_002a1db6;
    if (v < ref) {
      uVar6 = (iVar8 - uVar6) * 2 - 1;
      goto LAB_002a1db6;
    }
    iVar8 = uVar6 - iVar8;
  }
  uVar6 = iVar8 * 2;
LAB_002a1db6:
  iVar8 = 0;
  if (3 << ((byte)k & 0x1f) < (int)uVar5) {
    uVar1 = uVar6 & 0xffff;
    uVar7 = (uint)k;
    uVar4 = (uint)k;
    iVar9 = 0;
    iVar2 = iVar8;
    do {
      iVar8 = (1 << ((byte)uVar7 & 0x1f)) + iVar9;
      od_ec_encode_bool_q15(&w->ec,(uint)(iVar8 <= (int)uVar1),0x4000);
      if ((int)uVar1 < iVar8) {
        if ((int)uVar7 < 1) {
          return;
        }
        uVar7 = uVar7 + 1;
        do {
          od_ec_encode_bool_q15
                    (&w->ec,(uint)((uVar1 - iVar9 >> (uVar7 - 2 & 0x1f) & 1) != 0),0x4000);
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
        return;
      }
      bVar3 = (byte)uVar4;
      uVar7 = iVar2 + (uint)k;
      uVar4 = uVar4 + 1;
      iVar9 = iVar8;
      iVar2 = iVar2 + 1;
    } while ((3 << (bVar3 & 0x1f)) + iVar8 < (int)uVar5);
  }
  if (1 < (ushort)(uVar5 - iVar8)) {
    uVar5 = uVar5 - iVar8 & 0xffff;
    iVar9 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar9 == 0; iVar9 = iVar9 + -1) {
      }
    }
    iVar2 = (2 << ((byte)iVar9 & 0x1f)) - uVar5;
    uVar6 = uVar6 - iVar8 & 0xffff;
    if (iVar2 <= (int)uVar6) {
      uVar5 = iVar9 + 1;
      do {
        od_ec_encode_bool_q15
                  (&w->ec,(uint)(((uint)(((int)(uVar6 - iVar2) >> 1) + iVar2) >> (uVar5 - 2 & 0x1f)
                                 & 1) != 0),0x4000);
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
      od_ec_encode_bool_q15(&w->ec,uVar6 - iVar2 & 1,0x4000);
      return;
    }
    uVar5 = iVar9 + 1;
    do {
      od_ec_encode_bool_q15(&w->ec,(uint)((uVar6 >> (uVar5 - 2 & 0x1f) & 1) != 0),0x4000);
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  return;
}

Assistant:

void aom_write_primitive_refsubexpfin(aom_writer *w, uint16_t n, uint16_t k,
                                      uint16_t ref, uint16_t v) {
  write_primitive_subexpfin(w, n, k, recenter_finite_nonneg(n, ref, v));
}